

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.hpp
# Opt level: O0

void __thiscall cppurses::Event_loop::Event_loop(Event_loop *this)

{
  less<int> local_12;
  Optional_last_value<void> local_11;
  Event_loop *local_10;
  Event_loop *this_local;
  
  this->_vptr_Event_loop = (_func_int **)&PTR__Event_loop_0028d198;
  this->is_main_thread_ = false;
  local_10 = this;
  std::future<int>::future(&this->fut_);
  this->return_code_ = 0;
  std::atomic<bool>::atomic(&this->exit_,false);
  this->running_ = false;
  sig::
  Signal<void_(),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_()>,_std::mutex>
  ::Signal(&this->lifetime,&local_11,&local_12);
  connect_to_system_exit(this);
  return;
}

Assistant:

Event_loop() { this->connect_to_system_exit(); }